

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef fold_simplify_numadd_negx(jit_State *J)

{
  bool bVar1;
  
  bVar1 = ((J->fold).left[0].field_1.t.irt & 0x40) == 0;
  if (bVar1) {
    (J->fold).ins.field_1.o = '*';
    (J->fold).ins.field_0.op1 = (J->fold).ins.field_0.op2;
    (J->fold).ins.field_0.op2 = (J->fold).left[0].field_0.op1;
  }
  return (uint)bVar1;
}

Assistant:

LJFOLD(ADD NEG any)
LJFOLDF(simplify_numadd_negx)
{
  PHIBARRIER(fleft);
  fins->o = IR_SUB;  /* (-a) + b ==> b - a */
  fins->op1 = fins->op2;
  fins->op2 = fleft->op1;
  return RETRYFOLD;
}